

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  BYTE *pBVar5;
  ulong *iEnd;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  ZSTD_matchState_t *pZVar10;
  ulong *mEnd;
  BYTE *pBVar11;
  U32 *pUVar12;
  U32 *pUVar13;
  seqDef *psVar14;
  ulong uVar15;
  undefined8 uVar16;
  bool bVar17;
  uint uVar18;
  seqDef **ppsVar19;
  size_t sVar20;
  BYTE *pBVar21;
  byte bVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong *puVar27;
  BYTE *litEnd;
  BYTE *pBVar28;
  ulong uVar29;
  BYTE *litEnd_2;
  ulong *puVar30;
  BYTE *iStart;
  ulong *puVar31;
  int *piVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  uint uVar36;
  U32 UVar38;
  BYTE *litEnd_1;
  ulong *puVar39;
  ulong *puVar40;
  BYTE *unaff_R13;
  U32 UVar41;
  U32 UVar42;
  int iVar43;
  BYTE *base;
  BYTE *ilimit;
  U32 prefixStartIndex;
  BYTE *litLimit_w_6;
  BYTE *litLimit_w;
  BYTE *iend;
  BYTE *prefixStart;
  U32 dictIndexDelta;
  BYTE *dictBase;
  BYTE *dictEnd;
  U32 *hashTable;
  U32 dictStartIndex;
  BYTE *dictStart;
  U32 *dictHashTable;
  U32 local_10c;
  ulong uVar37;
  
  pBVar9 = (ms->window).base;
  uVar6 = (ms->window).dictLimit;
  iStart = pBVar9 + uVar6;
  pZVar10 = ms->dictMatchState;
  uVar7 = (pZVar10->window).dictLimit;
  mEnd = (ulong *)(pZVar10->window).nextSrc;
  pBVar11 = (pZVar10->window).base;
  pBVar28 = pBVar11 + uVar7;
  uVar36 = ((int)pBVar11 - (int)mEnd) + uVar6;
  uVar37 = (ulong)uVar36;
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  puVar39 = (ulong *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar28) + (long)src);
  uVar8 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  local_10c = *rep;
  UVar42 = rep[1];
  pUVar13 = pZVar10->hashTable;
  iVar43 = (int)pBVar9;
  if (uVar8 == 5) {
    if (puVar39 < puVar4) {
      uVar8 = (ms->cParams).targetLength;
      uVar23 = (ulong)(uVar8 + (uVar8 == 0));
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      uVar8 = (pZVar10->cParams).hashLog;
      puVar1 = iEnd + -4;
      ppsVar19 = &seqStore->sequences;
      do {
        uVar24 = *puVar39;
        uVar33 = uVar24 * -0x30e4432345000000 >> (bVar22 & 0x3f);
        uVar29 = (long)puVar39 - (long)pBVar9;
        UVar41 = (U32)uVar29;
        uVar25 = (UVar41 - local_10c) + 1;
        piVar32 = (int *)(pBVar9 + uVar25);
        if (uVar25 < uVar6) {
          piVar32 = (int *)(pBVar11 + (uVar25 - uVar36));
        }
        uVar18 = pUVar12[uVar33];
        pUVar12[uVar33] = UVar41;
        if (((uVar6 - 1) - uVar25 < 3) || (*piVar32 != *(int *)((long)puVar39 + 1))) {
          puVar40 = puVar39;
          if (uVar6 < uVar18) {
            piVar32 = (int *)(pBVar9 + uVar18);
            if (*piVar32 == (int)*puVar39) {
              puVar30 = (ulong *)((long)puVar39 + 4);
              puVar27 = (ulong *)(piVar32 + 1);
              puVar31 = puVar30;
              if (puVar30 < (ulong *)((long)iEnd - 7U)) {
                uVar33 = *puVar30 ^ *puVar27;
                uVar24 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                pBVar21 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                if (*puVar27 == *puVar30) {
                  puVar31 = (ulong *)((long)puVar39 + 0xc);
                  puVar27 = (ulong *)(piVar32 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar31) goto LAB_005e79bc;
                    uVar24 = *puVar27;
                    uVar33 = *puVar31;
                    uVar35 = uVar33 ^ uVar24;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    pBVar21 = (BYTE *)((long)puVar31 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar30))
                    ;
                    puVar31 = puVar31 + 1;
                    puVar27 = puVar27 + 1;
                  } while (uVar24 == uVar33);
                }
              }
              else {
LAB_005e79bc:
                if ((puVar31 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar27 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar31 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar31))
                {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar31 < iEnd) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar31));
                }
                pBVar21 = (BYTE *)((long)puVar31 - (long)puVar30);
              }
              unaff_R13 = pBVar21 + 4;
              if ((uVar6 < uVar18) && (src < puVar39)) {
                pBVar21 = pBVar9 + ((ulong)uVar18 - 1);
                do {
                  puVar27 = (ulong *)((long)puVar40 + -1);
                  if ((*(BYTE *)puVar27 != *pBVar21) ||
                     (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= iStart)) break;
                  pBVar21 = pBVar21 + -1;
                } while (src < puVar27);
              }
              uVar24 = (long)puVar40 - (long)src;
              if (puVar1 < puVar40) {
                puVar30 = (ulong *)seqStore->lit;
                puVar27 = puVar30;
                puVar31 = (ulong *)src;
                if (src <= puVar1) {
                  puVar27 = (ulong *)((long)puVar30 + ((long)puVar1 - (long)src));
                  uVar33 = *(ulong *)((long)src + 8);
                  *puVar30 = *src;
                  puVar30[1] = uVar33;
                  puVar31 = puVar1;
                  if (0x10 < (long)puVar1 - (long)src) {
                    lVar34 = 0x10;
                    do {
                      uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                      puVar3 = (undefined8 *)((long)puVar30 + lVar34);
                      *puVar3 = *(undefined8 *)((long)src + lVar34);
                      puVar3[1] = uVar16;
                      pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                      uVar16 = *(undefined8 *)(pBVar21 + 8);
                      puVar3[2] = *(undefined8 *)pBVar21;
                      puVar3[3] = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (puVar3 + 4 < puVar27);
                  }
                }
                if (puVar31 < puVar40) {
                  lVar34 = 0;
                  do {
                    *(BYTE *)((long)puVar27 + lVar34) = *(BYTE *)((long)puVar31 + lVar34);
                    lVar34 = lVar34 + 1;
                  } while ((long)puVar40 - (long)puVar31 != lVar34);
                }
              }
              else {
                puVar27 = (ulong *)seqStore->lit;
                uVar33 = *(ulong *)((long)src + 8);
                *puVar27 = *src;
                puVar27[1] = uVar33;
                if (0x10 < uVar24) {
                  pBVar21 = seqStore->lit;
                  uVar33 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar33;
                  if (0x20 < (long)uVar24) {
                    lVar34 = 0;
                    do {
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      pBVar2 = pBVar21 + lVar34 + 0x20;
                      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 8) = uVar16;
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar24);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar24;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar38 = (int)puVar39 - (int)piVar32;
              pBVar21 = unaff_R13 + -3;
              psVar14 = *ppsVar19;
              psVar14->litLength = (U16)uVar24;
              psVar14->offset = UVar38 + 3;
              UVar42 = local_10c;
              goto joined_r0x005e7b95;
            }
            puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
          }
          else {
            uVar25 = pUVar13[uVar24 * -0x30e4432345000000 >> (0x40U - (char)uVar8 & 0x3f)];
            if ((uVar7 < uVar25) && (*(int *)(pBVar11 + uVar25) == (int)*puVar39)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar11 + uVar25) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar20 + 4);
              if ((uVar7 < uVar25) && (src < puVar39)) {
                pBVar21 = pBVar11 + ((ulong)uVar25 - 1);
                do {
                  puVar27 = (ulong *)((long)puVar39 + -1);
                  puVar40 = puVar39;
                  if ((*(BYTE *)puVar27 != *pBVar21) ||
                     (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= pBVar28)) break;
                  pBVar21 = pBVar21 + -1;
                  puVar39 = puVar27;
                } while (src < puVar27);
              }
              uVar24 = (long)puVar40 - (long)src;
              if (puVar1 < puVar40) {
                puVar27 = (ulong *)seqStore->lit;
                puVar39 = puVar27;
                puVar30 = (ulong *)src;
                if (src <= puVar1) {
                  puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
                  uVar33 = *(ulong *)((long)src + 8);
                  *puVar27 = *src;
                  puVar27[1] = uVar33;
                  puVar30 = puVar1;
                  if (0x10 < (long)puVar1 - (long)src) {
                    lVar34 = 0x10;
                    do {
                      uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                      puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                      *puVar3 = *(undefined8 *)((long)src + lVar34);
                      puVar3[1] = uVar16;
                      pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                      uVar16 = *(undefined8 *)(pBVar21 + 8);
                      puVar3[2] = *(undefined8 *)pBVar21;
                      puVar3[3] = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (puVar3 + 4 < puVar39);
                  }
                }
                if (puVar30 < puVar40) {
                  lVar34 = 0;
                  do {
                    *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
                    lVar34 = lVar34 + 1;
                  } while ((long)puVar40 - (long)puVar30 != lVar34);
                }
              }
              else {
                puVar39 = (ulong *)seqStore->lit;
                uVar33 = *(ulong *)((long)src + 8);
                *puVar39 = *src;
                puVar39[1] = uVar33;
                if (0x10 < uVar24) {
                  pBVar21 = seqStore->lit;
                  uVar33 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar33;
                  if (0x20 < (long)uVar24) {
                    lVar34 = 0;
                    do {
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      pBVar2 = pBVar21 + lVar34 + 0x20;
                      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 8) = uVar16;
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar24);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar24;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar38 = UVar41 - (uVar36 + uVar25);
              psVar14 = seqStore->sequences;
              psVar14->litLength = (U16)uVar24;
              psVar14->offset = UVar38 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar14 + 1;
              bVar17 = true;
              UVar42 = local_10c;
              local_10c = UVar38;
            }
            else {
              puVar40 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
              bVar17 = false;
            }
            puVar39 = puVar40;
            if (bVar17) goto LAB_005e7e1b;
          }
        }
        else {
          puVar40 = (ulong *)((long)puVar39 + 1);
          puVar27 = iEnd;
          if (uVar25 < uVar6) {
            puVar27 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar27,iStart);
          uVar24 = (long)puVar40 - (long)src;
          if (puVar1 < puVar40) {
            puVar27 = (ulong *)seqStore->lit;
            puVar39 = puVar27;
            puVar30 = (ulong *)src;
            if (src <= puVar1) {
              puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
              uVar33 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar33;
              puVar30 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar34 = 0x10;
                do {
                  uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                  puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                  *puVar3 = *(undefined8 *)((long)src + lVar34);
                  puVar3[1] = uVar16;
                  pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                  uVar16 = *(undefined8 *)(pBVar21 + 8);
                  puVar3[2] = *(undefined8 *)pBVar21;
                  puVar3[3] = uVar16;
                  lVar34 = lVar34 + 0x20;
                } while (puVar3 + 4 < puVar39);
              }
            }
            if (puVar30 < puVar40) {
              lVar34 = 0;
              do {
                *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
                lVar34 = lVar34 + 1;
              } while ((long)puVar40 - (long)puVar30 != lVar34);
            }
          }
          else {
            puVar39 = (ulong *)seqStore->lit;
            uVar33 = *(ulong *)((long)src + 8);
            *puVar39 = *src;
            puVar39[1] = uVar33;
            if (0x10 < uVar24) {
              pBVar21 = seqStore->lit;
              uVar33 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar21 + 0x18) = uVar33;
              if (0x20 < (long)uVar24) {
                lVar34 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                  uVar16 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar21 + lVar34 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar16;
                  pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                  uVar16 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar2 + 0x20 < pBVar21 + uVar24);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar24;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar20 + 4);
          pBVar21 = (BYTE *)(sVar20 + 1);
          psVar14 = *ppsVar19;
          psVar14->litLength = (U16)uVar24;
          psVar14->offset = 1;
          UVar38 = local_10c;
joined_r0x005e7b95:
          local_10c = UVar38;
          if ((BYTE *)0xffff < pBVar21) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->matchLength = (U16)pBVar21;
          *ppsVar19 = psVar14 + 1;
LAB_005e7e1b:
          src = (void *)((long)puVar40 + (long)unaff_R13);
          puVar39 = (ulong *)src;
          if (src <= puVar4) {
            pUVar12[(ulong)(*(long *)(pBVar9 + (uVar29 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                    (bVar22 & 0x3f)] = UVar41 + 2;
            pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e4432345000000) >> (bVar22 & 0x3f)] =
                 ((int)src + -2) - iVar43;
            do {
              puVar39 = (ulong *)src;
              if (puVar4 < src) break;
              UVar41 = (int)src - iVar43;
              uVar25 = UVar41 - UVar42;
              pBVar21 = pBVar9;
              if (uVar25 < uVar6) {
                pBVar21 = pBVar11 + -uVar37;
              }
              if (((uVar6 - 1) - uVar25 < 3) || (*(int *)(pBVar21 + uVar25) != (int)*src)) {
                bVar17 = false;
                UVar41 = UVar42;
              }
              else {
                puVar39 = iEnd;
                if (uVar25 < uVar6) {
                  puVar39 = mEnd;
                }
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar25) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar39,iStart);
                if (src <= puVar1) {
                  puVar39 = (ulong *)seqStore->lit;
                  uVar24 = *(ulong *)((long)src + 8);
                  *puVar39 = *src;
                  puVar39[1] = uVar24;
                }
                psVar14 = seqStore->sequences;
                psVar14->litLength = 0;
                psVar14->offset = 1;
                if (0xffff < sVar20 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar14->matchLength = (U16)(sVar20 + 1);
                seqStore->sequences = psVar14 + 1;
                pUVar12[*src * -0x30e4432345000000 >> (bVar22 & 0x3f)] = UVar41;
                src = (void *)((long)src + sVar20 + 4);
                bVar17 = true;
                UVar41 = local_10c;
                local_10c = UVar42;
              }
              UVar42 = UVar41;
              puVar39 = (ulong *)src;
            } while (bVar17);
          }
        }
      } while (puVar39 < puVar4);
    }
  }
  else if (uVar8 == 6) {
    if (puVar39 < puVar4) {
      uVar8 = (ms->cParams).targetLength;
      uVar23 = (ulong)(uVar8 + (uVar8 == 0));
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      uVar8 = (pZVar10->cParams).hashLog;
      puVar1 = iEnd + -4;
      ppsVar19 = &seqStore->sequences;
      do {
        uVar24 = *puVar39;
        uVar33 = uVar24 * -0x30e4432340650000 >> (bVar22 & 0x3f);
        uVar29 = (long)puVar39 - (long)pBVar9;
        UVar41 = (U32)uVar29;
        uVar25 = (UVar41 - local_10c) + 1;
        piVar32 = (int *)(pBVar9 + uVar25);
        if (uVar25 < uVar6) {
          piVar32 = (int *)(pBVar11 + (uVar25 - uVar36));
        }
        uVar18 = pUVar12[uVar33];
        pUVar12[uVar33] = UVar41;
        if (((uVar6 - 1) - uVar25 < 3) || (*piVar32 != *(int *)((long)puVar39 + 1))) {
          puVar40 = puVar39;
          if (uVar6 < uVar18) {
            piVar32 = (int *)(pBVar9 + uVar18);
            if (*piVar32 == (int)*puVar39) {
              puVar30 = (ulong *)((long)puVar39 + 4);
              puVar27 = (ulong *)(piVar32 + 1);
              puVar31 = puVar30;
              if (puVar30 < (ulong *)((long)iEnd - 7U)) {
                uVar33 = *puVar30 ^ *puVar27;
                uVar24 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                pBVar21 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                if (*puVar27 == *puVar30) {
                  puVar31 = (ulong *)((long)puVar39 + 0xc);
                  puVar27 = (ulong *)(piVar32 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar31) goto LAB_005e700a;
                    uVar24 = *puVar27;
                    uVar33 = *puVar31;
                    uVar35 = uVar33 ^ uVar24;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    pBVar21 = (BYTE *)((long)puVar31 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar30))
                    ;
                    puVar31 = puVar31 + 1;
                    puVar27 = puVar27 + 1;
                  } while (uVar24 == uVar33);
                }
              }
              else {
LAB_005e700a:
                if ((puVar31 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar27 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar31 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar31))
                {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar31 < iEnd) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar31));
                }
                pBVar21 = (BYTE *)((long)puVar31 - (long)puVar30);
              }
              unaff_R13 = pBVar21 + 4;
              if ((uVar6 < uVar18) && (src < puVar39)) {
                pBVar21 = pBVar9 + ((ulong)uVar18 - 1);
                do {
                  puVar27 = (ulong *)((long)puVar40 + -1);
                  if ((*(BYTE *)puVar27 != *pBVar21) ||
                     (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= iStart)) break;
                  pBVar21 = pBVar21 + -1;
                } while (src < puVar27);
              }
              uVar24 = (long)puVar40 - (long)src;
              if (puVar1 < puVar40) {
                puVar30 = (ulong *)seqStore->lit;
                puVar27 = puVar30;
                puVar31 = (ulong *)src;
                if (src <= puVar1) {
                  puVar27 = (ulong *)((long)puVar30 + ((long)puVar1 - (long)src));
                  uVar33 = *(ulong *)((long)src + 8);
                  *puVar30 = *src;
                  puVar30[1] = uVar33;
                  puVar31 = puVar1;
                  if (0x10 < (long)puVar1 - (long)src) {
                    lVar34 = 0x10;
                    do {
                      uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                      puVar3 = (undefined8 *)((long)puVar30 + lVar34);
                      *puVar3 = *(undefined8 *)((long)src + lVar34);
                      puVar3[1] = uVar16;
                      pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                      uVar16 = *(undefined8 *)(pBVar21 + 8);
                      puVar3[2] = *(undefined8 *)pBVar21;
                      puVar3[3] = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (puVar3 + 4 < puVar27);
                  }
                }
                if (puVar31 < puVar40) {
                  lVar34 = 0;
                  do {
                    *(BYTE *)((long)puVar27 + lVar34) = *(BYTE *)((long)puVar31 + lVar34);
                    lVar34 = lVar34 + 1;
                  } while ((long)puVar40 - (long)puVar31 != lVar34);
                }
              }
              else {
                puVar27 = (ulong *)seqStore->lit;
                uVar33 = *(ulong *)((long)src + 8);
                *puVar27 = *src;
                puVar27[1] = uVar33;
                if (0x10 < uVar24) {
                  pBVar21 = seqStore->lit;
                  uVar33 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar33;
                  if (0x20 < (long)uVar24) {
                    lVar34 = 0;
                    do {
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      pBVar2 = pBVar21 + lVar34 + 0x20;
                      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 8) = uVar16;
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar24);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar24;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar38 = (int)puVar39 - (int)piVar32;
              pBVar21 = unaff_R13 + -3;
              psVar14 = *ppsVar19;
              psVar14->litLength = (U16)uVar24;
              psVar14->offset = UVar38 + 3;
              UVar42 = local_10c;
              goto joined_r0x005e71e8;
            }
            puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
          }
          else {
            uVar25 = pUVar13[uVar24 * -0x30e4432340650000 >> (0x40U - (char)uVar8 & 0x3f)];
            if ((uVar7 < uVar25) && (*(int *)(pBVar11 + uVar25) == (int)*puVar39)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar11 + uVar25) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar20 + 4);
              if ((uVar7 < uVar25) && (src < puVar39)) {
                pBVar21 = pBVar11 + ((ulong)uVar25 - 1);
                do {
                  puVar27 = (ulong *)((long)puVar39 + -1);
                  puVar40 = puVar39;
                  if ((*(BYTE *)puVar27 != *pBVar21) ||
                     (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= pBVar28)) break;
                  pBVar21 = pBVar21 + -1;
                  puVar39 = puVar27;
                } while (src < puVar27);
              }
              uVar24 = (long)puVar40 - (long)src;
              if (puVar1 < puVar40) {
                puVar27 = (ulong *)seqStore->lit;
                puVar39 = puVar27;
                puVar30 = (ulong *)src;
                if (src <= puVar1) {
                  puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
                  uVar33 = *(ulong *)((long)src + 8);
                  *puVar27 = *src;
                  puVar27[1] = uVar33;
                  puVar30 = puVar1;
                  if (0x10 < (long)puVar1 - (long)src) {
                    lVar34 = 0x10;
                    do {
                      uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                      puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                      *puVar3 = *(undefined8 *)((long)src + lVar34);
                      puVar3[1] = uVar16;
                      pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                      uVar16 = *(undefined8 *)(pBVar21 + 8);
                      puVar3[2] = *(undefined8 *)pBVar21;
                      puVar3[3] = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (puVar3 + 4 < puVar39);
                  }
                }
                if (puVar30 < puVar40) {
                  lVar34 = 0;
                  do {
                    *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
                    lVar34 = lVar34 + 1;
                  } while ((long)puVar40 - (long)puVar30 != lVar34);
                }
              }
              else {
                puVar39 = (ulong *)seqStore->lit;
                uVar33 = *(ulong *)((long)src + 8);
                *puVar39 = *src;
                puVar39[1] = uVar33;
                if (0x10 < uVar24) {
                  pBVar21 = seqStore->lit;
                  uVar33 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar33;
                  if (0x20 < (long)uVar24) {
                    lVar34 = 0;
                    do {
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      pBVar2 = pBVar21 + lVar34 + 0x20;
                      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 8) = uVar16;
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar24);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar24;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar38 = UVar41 - (uVar36 + uVar25);
              psVar14 = seqStore->sequences;
              psVar14->litLength = (U16)uVar24;
              psVar14->offset = UVar38 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar14 + 1;
              bVar17 = true;
              UVar42 = local_10c;
              local_10c = UVar38;
            }
            else {
              puVar40 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
              bVar17 = false;
            }
            puVar39 = puVar40;
            if (bVar17) goto LAB_005e747b;
          }
        }
        else {
          puVar40 = (ulong *)((long)puVar39 + 1);
          puVar27 = iEnd;
          if (uVar25 < uVar6) {
            puVar27 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar27,iStart);
          uVar24 = (long)puVar40 - (long)src;
          if (puVar1 < puVar40) {
            puVar27 = (ulong *)seqStore->lit;
            puVar39 = puVar27;
            puVar30 = (ulong *)src;
            if (src <= puVar1) {
              puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
              uVar33 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar33;
              puVar30 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar34 = 0x10;
                do {
                  uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                  puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                  *puVar3 = *(undefined8 *)((long)src + lVar34);
                  puVar3[1] = uVar16;
                  pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                  uVar16 = *(undefined8 *)(pBVar21 + 8);
                  puVar3[2] = *(undefined8 *)pBVar21;
                  puVar3[3] = uVar16;
                  lVar34 = lVar34 + 0x20;
                } while (puVar3 + 4 < puVar39);
              }
            }
            if (puVar30 < puVar40) {
              lVar34 = 0;
              do {
                *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
                lVar34 = lVar34 + 1;
              } while ((long)puVar40 - (long)puVar30 != lVar34);
            }
          }
          else {
            puVar39 = (ulong *)seqStore->lit;
            uVar33 = *(ulong *)((long)src + 8);
            *puVar39 = *src;
            puVar39[1] = uVar33;
            if (0x10 < uVar24) {
              pBVar21 = seqStore->lit;
              uVar33 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar21 + 0x18) = uVar33;
              if (0x20 < (long)uVar24) {
                lVar34 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                  uVar16 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar21 + lVar34 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar16;
                  pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                  uVar16 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar2 + 0x20 < pBVar21 + uVar24);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar24;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar20 + 4);
          pBVar21 = (BYTE *)(sVar20 + 1);
          psVar14 = *ppsVar19;
          psVar14->litLength = (U16)uVar24;
          psVar14->offset = 1;
          UVar38 = local_10c;
joined_r0x005e71e8:
          local_10c = UVar38;
          if ((BYTE *)0xffff < pBVar21) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->matchLength = (U16)pBVar21;
          *ppsVar19 = psVar14 + 1;
LAB_005e747b:
          src = (void *)((long)puVar40 + (long)unaff_R13);
          puVar39 = (ulong *)src;
          if (src <= puVar4) {
            pUVar12[(ulong)(*(long *)(pBVar9 + (uVar29 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                    (bVar22 & 0x3f)] = UVar41 + 2;
            pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e4432340650000) >> (bVar22 & 0x3f)] =
                 ((int)src + -2) - iVar43;
            do {
              puVar39 = (ulong *)src;
              if (puVar4 < src) break;
              UVar41 = (int)src - iVar43;
              uVar25 = UVar41 - UVar42;
              pBVar21 = pBVar9;
              if (uVar25 < uVar6) {
                pBVar21 = pBVar11 + -uVar37;
              }
              if (((uVar6 - 1) - uVar25 < 3) || (*(int *)(pBVar21 + uVar25) != (int)*src)) {
                bVar17 = false;
                UVar41 = UVar42;
              }
              else {
                puVar39 = iEnd;
                if (uVar25 < uVar6) {
                  puVar39 = mEnd;
                }
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar25) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar39,iStart);
                if (src <= puVar1) {
                  puVar39 = (ulong *)seqStore->lit;
                  uVar24 = *(ulong *)((long)src + 8);
                  *puVar39 = *src;
                  puVar39[1] = uVar24;
                }
                psVar14 = seqStore->sequences;
                psVar14->litLength = 0;
                psVar14->offset = 1;
                if (0xffff < sVar20 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar14->matchLength = (U16)(sVar20 + 1);
                seqStore->sequences = psVar14 + 1;
                pUVar12[*src * -0x30e4432340650000 >> (bVar22 & 0x3f)] = UVar41;
                src = (void *)((long)src + sVar20 + 4);
                bVar17 = true;
                UVar41 = local_10c;
                local_10c = UVar42;
              }
              UVar42 = UVar41;
              puVar39 = (ulong *)src;
            } while (bVar17);
          }
        }
      } while (puVar39 < puVar4);
    }
  }
  else if (uVar8 == 7) {
    if (puVar39 < puVar4) {
      uVar8 = (ms->cParams).targetLength;
      uVar23 = (ulong)(uVar8 + (uVar8 == 0));
      bVar22 = 0x40 - (char)(ms->cParams).hashLog;
      uVar8 = (pZVar10->cParams).hashLog;
      puVar1 = iEnd + -4;
      ppsVar19 = &seqStore->sequences;
      do {
        uVar24 = *puVar39;
        uVar33 = uVar24 * -0x30e44323405a9d00 >> (bVar22 & 0x3f);
        uVar29 = (long)puVar39 - (long)pBVar9;
        UVar41 = (U32)uVar29;
        uVar25 = (UVar41 - local_10c) + 1;
        piVar32 = (int *)(pBVar9 + uVar25);
        if (uVar25 < uVar6) {
          piVar32 = (int *)(pBVar11 + (uVar25 - uVar36));
        }
        uVar18 = pUVar12[uVar33];
        pUVar12[uVar33] = UVar41;
        if (((uVar6 - 1) - uVar25 < 3) || (*piVar32 != *(int *)((long)puVar39 + 1))) {
          puVar40 = puVar39;
          if (uVar6 < uVar18) {
            piVar32 = (int *)(pBVar9 + uVar18);
            if (*piVar32 == (int)*puVar39) {
              puVar30 = (ulong *)((long)puVar39 + 4);
              puVar27 = (ulong *)(piVar32 + 1);
              puVar31 = puVar30;
              if (puVar30 < (ulong *)((long)iEnd - 7U)) {
                uVar33 = *puVar30 ^ *puVar27;
                uVar24 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                  }
                }
                pBVar21 = (BYTE *)(uVar24 >> 3 & 0x1fffffff);
                if (*puVar27 == *puVar30) {
                  puVar31 = (ulong *)((long)puVar39 + 0xc);
                  puVar27 = (ulong *)(piVar32 + 3);
                  do {
                    if ((ulong *)((long)iEnd - 7U) <= puVar31) goto LAB_005e6644;
                    uVar24 = *puVar27;
                    uVar33 = *puVar31;
                    uVar35 = uVar33 ^ uVar24;
                    uVar15 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    pBVar21 = (BYTE *)((long)puVar31 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar30))
                    ;
                    puVar31 = puVar31 + 1;
                    puVar27 = puVar27 + 1;
                  } while (uVar24 == uVar33);
                }
              }
              else {
LAB_005e6644:
                if ((puVar31 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar27 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar27 = (ulong *)((long)puVar27 + 4);
                }
                if ((puVar31 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar31))
                {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar27 = (ulong *)((long)puVar27 + 2);
                }
                if (puVar31 < iEnd) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar31));
                }
                pBVar21 = (BYTE *)((long)puVar31 - (long)puVar30);
              }
              unaff_R13 = pBVar21 + 4;
              if ((uVar6 < uVar18) && (src < puVar39)) {
                pBVar21 = pBVar9 + ((ulong)uVar18 - 1);
                do {
                  puVar27 = (ulong *)((long)puVar40 + -1);
                  if ((*(BYTE *)puVar27 != *pBVar21) ||
                     (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= iStart)) break;
                  pBVar21 = pBVar21 + -1;
                } while (src < puVar27);
              }
              uVar24 = (long)puVar40 - (long)src;
              if (puVar1 < puVar40) {
                puVar30 = (ulong *)seqStore->lit;
                puVar27 = puVar30;
                puVar31 = (ulong *)src;
                if (src <= puVar1) {
                  puVar27 = (ulong *)((long)puVar30 + ((long)puVar1 - (long)src));
                  uVar33 = *(ulong *)((long)src + 8);
                  *puVar30 = *src;
                  puVar30[1] = uVar33;
                  puVar31 = puVar1;
                  if (0x10 < (long)puVar1 - (long)src) {
                    lVar34 = 0x10;
                    do {
                      uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                      puVar3 = (undefined8 *)((long)puVar30 + lVar34);
                      *puVar3 = *(undefined8 *)((long)src + lVar34);
                      puVar3[1] = uVar16;
                      pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                      uVar16 = *(undefined8 *)(pBVar21 + 8);
                      puVar3[2] = *(undefined8 *)pBVar21;
                      puVar3[3] = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (puVar3 + 4 < puVar27);
                  }
                }
                if (puVar31 < puVar40) {
                  lVar34 = 0;
                  do {
                    *(BYTE *)((long)puVar27 + lVar34) = *(BYTE *)((long)puVar31 + lVar34);
                    lVar34 = lVar34 + 1;
                  } while ((long)puVar40 - (long)puVar31 != lVar34);
                }
              }
              else {
                puVar27 = (ulong *)seqStore->lit;
                uVar33 = *(ulong *)((long)src + 8);
                *puVar27 = *src;
                puVar27[1] = uVar33;
                if (0x10 < uVar24) {
                  pBVar21 = seqStore->lit;
                  uVar33 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar33;
                  if (0x20 < (long)uVar24) {
                    lVar34 = 0;
                    do {
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      pBVar2 = pBVar21 + lVar34 + 0x20;
                      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 8) = uVar16;
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar24);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar24;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar38 = (int)puVar39 - (int)piVar32;
              pBVar21 = unaff_R13 + -3;
              psVar14 = *ppsVar19;
              psVar14->litLength = (U16)uVar24;
              psVar14->offset = UVar38 + 3;
              UVar42 = local_10c;
              goto joined_r0x005e6822;
            }
            puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
          }
          else {
            uVar25 = pUVar13[uVar24 * -0x30e44323405a9d00 >> (0x40U - (char)uVar8 & 0x3f)];
            if ((uVar7 < uVar25) && (*(int *)(pBVar11 + uVar25) == (int)*puVar39)) {
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar11 + uVar25) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)mEnd,iStart);
              unaff_R13 = (BYTE *)(sVar20 + 4);
              if ((uVar7 < uVar25) && (src < puVar39)) {
                pBVar21 = pBVar11 + ((ulong)uVar25 - 1);
                do {
                  puVar27 = (ulong *)((long)puVar39 + -1);
                  puVar40 = puVar39;
                  if ((*(BYTE *)puVar27 != *pBVar21) ||
                     (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= pBVar28)) break;
                  pBVar21 = pBVar21 + -1;
                  puVar39 = puVar27;
                } while (src < puVar27);
              }
              uVar24 = (long)puVar40 - (long)src;
              if (puVar1 < puVar40) {
                puVar27 = (ulong *)seqStore->lit;
                puVar39 = puVar27;
                puVar30 = (ulong *)src;
                if (src <= puVar1) {
                  puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
                  uVar33 = *(ulong *)((long)src + 8);
                  *puVar27 = *src;
                  puVar27[1] = uVar33;
                  puVar30 = puVar1;
                  if (0x10 < (long)puVar1 - (long)src) {
                    lVar34 = 0x10;
                    do {
                      uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                      puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                      *puVar3 = *(undefined8 *)((long)src + lVar34);
                      puVar3[1] = uVar16;
                      pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                      uVar16 = *(undefined8 *)(pBVar21 + 8);
                      puVar3[2] = *(undefined8 *)pBVar21;
                      puVar3[3] = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (puVar3 + 4 < puVar39);
                  }
                }
                if (puVar30 < puVar40) {
                  lVar34 = 0;
                  do {
                    *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
                    lVar34 = lVar34 + 1;
                  } while ((long)puVar40 - (long)puVar30 != lVar34);
                }
              }
              else {
                puVar39 = (ulong *)seqStore->lit;
                uVar33 = *(ulong *)((long)src + 8);
                *puVar39 = *src;
                puVar39[1] = uVar33;
                if (0x10 < uVar24) {
                  pBVar21 = seqStore->lit;
                  uVar33 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar21 + 0x18) = uVar33;
                  if (0x20 < (long)uVar24) {
                    lVar34 = 0;
                    do {
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      pBVar2 = pBVar21 + lVar34 + 0x20;
                      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 8) = uVar16;
                      pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                      uVar16 = *(undefined8 *)(pBVar5 + 8);
                      *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                      *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                      lVar34 = lVar34 + 0x20;
                    } while (pBVar2 + 0x20 < pBVar21 + uVar24);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar24;
              if (0xffff < uVar24) {
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              UVar38 = UVar41 - (uVar36 + uVar25);
              psVar14 = seqStore->sequences;
              psVar14->litLength = (U16)uVar24;
              psVar14->offset = UVar38 + 3;
              if ((BYTE *)0xffff < unaff_R13 + -3) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->matchLength = (U16)(unaff_R13 + -3);
              seqStore->sequences = psVar14 + 1;
              bVar17 = true;
              UVar42 = local_10c;
              local_10c = UVar38;
            }
            else {
              puVar40 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
              bVar17 = false;
            }
            puVar39 = puVar40;
            if (bVar17) goto LAB_005e6ab5;
          }
        }
        else {
          puVar40 = (ulong *)((long)puVar39 + 1);
          puVar27 = iEnd;
          if (uVar25 < uVar6) {
            puVar27 = mEnd;
          }
          sVar20 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                              (BYTE *)puVar27,iStart);
          uVar24 = (long)puVar40 - (long)src;
          if (puVar1 < puVar40) {
            puVar27 = (ulong *)seqStore->lit;
            puVar39 = puVar27;
            puVar30 = (ulong *)src;
            if (src <= puVar1) {
              puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
              uVar33 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar33;
              puVar30 = puVar1;
              if (0x10 < (long)puVar1 - (long)src) {
                lVar34 = 0x10;
                do {
                  uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                  puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                  *puVar3 = *(undefined8 *)((long)src + lVar34);
                  puVar3[1] = uVar16;
                  pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                  uVar16 = *(undefined8 *)(pBVar21 + 8);
                  puVar3[2] = *(undefined8 *)pBVar21;
                  puVar3[3] = uVar16;
                  lVar34 = lVar34 + 0x20;
                } while (puVar3 + 4 < puVar39);
              }
            }
            if (puVar30 < puVar40) {
              lVar34 = 0;
              do {
                *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
                lVar34 = lVar34 + 1;
              } while ((long)puVar40 - (long)puVar30 != lVar34);
            }
          }
          else {
            puVar39 = (ulong *)seqStore->lit;
            uVar33 = *(ulong *)((long)src + 8);
            *puVar39 = *src;
            puVar39[1] = uVar33;
            if (0x10 < uVar24) {
              pBVar21 = seqStore->lit;
              uVar33 = *(ulong *)((long)src + 0x18);
              *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
              *(ulong *)(pBVar21 + 0x18) = uVar33;
              if (0x20 < (long)uVar24) {
                lVar34 = 0;
                do {
                  pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                  uVar16 = *(undefined8 *)(pBVar5 + 8);
                  pBVar2 = pBVar21 + lVar34 + 0x20;
                  *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 8) = uVar16;
                  pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                  uVar16 = *(undefined8 *)(pBVar5 + 8);
                  *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                  *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                  lVar34 = lVar34 + 0x20;
                } while (pBVar2 + 0x20 < pBVar21 + uVar24);
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar24;
          if (0xffff < uVar24) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          unaff_R13 = (BYTE *)(sVar20 + 4);
          pBVar21 = (BYTE *)(sVar20 + 1);
          psVar14 = *ppsVar19;
          psVar14->litLength = (U16)uVar24;
          psVar14->offset = 1;
          UVar38 = local_10c;
joined_r0x005e6822:
          local_10c = UVar38;
          if ((BYTE *)0xffff < pBVar21) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar14->matchLength = (U16)pBVar21;
          *ppsVar19 = psVar14 + 1;
LAB_005e6ab5:
          src = (void *)((long)puVar40 + (long)unaff_R13);
          puVar39 = (ulong *)src;
          if (src <= puVar4) {
            pUVar12[(ulong)(*(long *)(pBVar9 + (uVar29 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                    (bVar22 & 0x3f)] = UVar41 + 2;
            pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323405a9d00) >> (bVar22 & 0x3f)] =
                 ((int)src + -2) - iVar43;
            do {
              puVar39 = (ulong *)src;
              if (puVar4 < src) break;
              UVar41 = (int)src - iVar43;
              uVar25 = UVar41 - UVar42;
              pBVar21 = pBVar9;
              if (uVar25 < uVar6) {
                pBVar21 = pBVar11 + -uVar37;
              }
              if (((uVar6 - 1) - uVar25 < 3) || (*(int *)(pBVar21 + uVar25) != (int)*src)) {
                bVar17 = false;
                UVar41 = UVar42;
              }
              else {
                puVar39 = iEnd;
                if (uVar25 < uVar6) {
                  puVar39 = mEnd;
                }
                sVar20 = ZSTD_count_2segments
                                   ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar25) + 4),
                                    (BYTE *)iEnd,(BYTE *)puVar39,iStart);
                if (src <= puVar1) {
                  puVar39 = (ulong *)seqStore->lit;
                  uVar24 = *(ulong *)((long)src + 8);
                  *puVar39 = *src;
                  puVar39[1] = uVar24;
                }
                psVar14 = seqStore->sequences;
                psVar14->litLength = 0;
                psVar14->offset = 1;
                if (0xffff < sVar20 + 1) {
                  seqStore->longLengthType = ZSTD_llt_matchLength;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
                }
                psVar14->matchLength = (U16)(sVar20 + 1);
                seqStore->sequences = psVar14 + 1;
                pUVar12[*src * -0x30e44323405a9d00 >> (bVar22 & 0x3f)] = UVar41;
                src = (void *)((long)src + sVar20 + 4);
                bVar17 = true;
                UVar41 = local_10c;
                local_10c = UVar42;
              }
              UVar42 = UVar41;
              puVar39 = (ulong *)src;
            } while (bVar17);
          }
        }
      } while (puVar39 < puVar4);
    }
  }
  else if (puVar39 < puVar4) {
    uVar8 = (ms->cParams).targetLength;
    uVar23 = (ulong)(uVar8 + (uVar8 == 0));
    bVar22 = 0x20 - (char)(ms->cParams).hashLog;
    uVar8 = (pZVar10->cParams).hashLog;
    puVar1 = iEnd + -4;
    ppsVar19 = &seqStore->sequences;
    do {
      uVar26 = (uint)((int)*puVar39 * -0x61c8864f) >> (bVar22 & 0x1f);
      uVar24 = (long)puVar39 - (long)pBVar9;
      uVar25 = pUVar12[uVar26];
      UVar41 = (U32)uVar24;
      uVar18 = (UVar41 - local_10c) + 1;
      piVar32 = (int *)(pBVar9 + uVar18);
      if (uVar18 < uVar6) {
        piVar32 = (int *)(pBVar11 + (uVar18 - uVar36));
      }
      pUVar12[uVar26] = UVar41;
      if (((uVar6 - 1) - uVar18 < 3) || (*piVar32 != *(int *)((long)puVar39 + 1))) {
        puVar40 = puVar39;
        if (uVar6 < uVar25) {
          piVar32 = (int *)(pBVar9 + uVar25);
          if (*piVar32 == (int)*puVar39) {
            puVar30 = (ulong *)((long)puVar39 + 4);
            puVar27 = (ulong *)(piVar32 + 1);
            puVar31 = puVar30;
            if (puVar30 < (ulong *)((long)iEnd - 7U)) {
              uVar33 = *puVar30 ^ *puVar27;
              uVar29 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              pBVar21 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
              if (*puVar27 == *puVar30) {
                puVar31 = (ulong *)((long)puVar39 + 0xc);
                puVar27 = (ulong *)(piVar32 + 3);
                do {
                  if ((ulong *)((long)iEnd - 7U) <= puVar31) goto LAB_005e835b;
                  uVar29 = *puVar27;
                  uVar33 = *puVar31;
                  uVar35 = uVar33 ^ uVar29;
                  uVar15 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                    }
                  }
                  pBVar21 = (BYTE *)((long)puVar31 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar30));
                  puVar31 = puVar31 + 1;
                  puVar27 = puVar27 + 1;
                } while (uVar29 == uVar33);
              }
            }
            else {
LAB_005e835b:
              if ((puVar31 < (ulong *)((long)iEnd - 3U)) && ((int)*puVar27 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar27 = (ulong *)((long)puVar27 + 4);
              }
              if ((puVar31 < (ulong *)((long)iEnd + -1)) && ((short)*puVar27 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar27 = (ulong *)((long)puVar27 + 2);
              }
              if (puVar31 < iEnd) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar27 == (BYTE)*puVar31));
              }
              pBVar21 = (BYTE *)((long)puVar31 - (long)puVar30);
            }
            unaff_R13 = pBVar21 + 4;
            if ((uVar6 < uVar25) && (src < puVar39)) {
              pBVar21 = pBVar9 + ((ulong)uVar25 - 1);
              do {
                puVar27 = (ulong *)((long)puVar40 + -1);
                if ((*(BYTE *)puVar27 != *pBVar21) ||
                   (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= iStart)) break;
                pBVar21 = pBVar21 + -1;
              } while (src < puVar27);
            }
            uVar29 = (long)puVar40 - (long)src;
            if (puVar1 < puVar40) {
              puVar30 = (ulong *)seqStore->lit;
              puVar27 = puVar30;
              puVar31 = (ulong *)src;
              if (src <= puVar1) {
                puVar27 = (ulong *)((long)puVar30 + ((long)puVar1 - (long)src));
                uVar33 = *(ulong *)((long)src + 8);
                *puVar30 = *src;
                puVar30[1] = uVar33;
                puVar31 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar34 = 0x10;
                  do {
                    uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                    puVar3 = (undefined8 *)((long)puVar30 + lVar34);
                    *puVar3 = *(undefined8 *)((long)src + lVar34);
                    puVar3[1] = uVar16;
                    pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                    uVar16 = *(undefined8 *)(pBVar21 + 8);
                    puVar3[2] = *(undefined8 *)pBVar21;
                    puVar3[3] = uVar16;
                    lVar34 = lVar34 + 0x20;
                  } while (puVar3 + 4 < puVar27);
                }
              }
              if (puVar31 < puVar40) {
                lVar34 = 0;
                do {
                  *(BYTE *)((long)puVar27 + lVar34) = *(BYTE *)((long)puVar31 + lVar34);
                  lVar34 = lVar34 + 1;
                } while ((long)puVar40 - (long)puVar31 != lVar34);
              }
            }
            else {
              puVar27 = (ulong *)seqStore->lit;
              uVar33 = *(ulong *)((long)src + 8);
              *puVar27 = *src;
              puVar27[1] = uVar33;
              if (0x10 < uVar29) {
                pBVar21 = seqStore->lit;
                uVar33 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar21 + 0x18) = uVar33;
                if (0x20 < (long)uVar29) {
                  lVar34 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                    uVar16 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar21 + lVar34 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar16;
                    pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                    uVar16 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar21 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            UVar38 = (int)puVar39 - (int)piVar32;
            pBVar21 = unaff_R13 + -3;
            psVar14 = *ppsVar19;
            psVar14->litLength = (U16)uVar29;
            psVar14->offset = UVar38 + 3;
            UVar42 = local_10c;
            goto joined_r0x005e8539;
          }
          puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
        }
        else {
          uVar25 = pUVar13[(uint)((int)*puVar39 * -0x61c8864f) >> (0x20U - (char)uVar8 & 0x1f)];
          if ((uVar7 < uVar25) && (*(int *)(pBVar11 + uVar25) == (int)*puVar39)) {
            sVar20 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar39 + 4),(BYTE *)((long)(pBVar11 + uVar25) + 4),
                                (BYTE *)iEnd,(BYTE *)mEnd,iStart);
            unaff_R13 = (BYTE *)(sVar20 + 4);
            if ((uVar7 < uVar25) && (src < puVar39)) {
              pBVar21 = pBVar11 + ((ulong)uVar25 - 1);
              do {
                puVar27 = (ulong *)((long)puVar39 + -1);
                puVar40 = puVar39;
                if ((*(BYTE *)puVar27 != *pBVar21) ||
                   (unaff_R13 = unaff_R13 + 1, puVar40 = puVar27, pBVar21 <= pBVar28)) break;
                pBVar21 = pBVar21 + -1;
                puVar39 = puVar27;
              } while (src < puVar27);
            }
            uVar29 = (long)puVar40 - (long)src;
            if (puVar1 < puVar40) {
              puVar27 = (ulong *)seqStore->lit;
              puVar39 = puVar27;
              puVar30 = (ulong *)src;
              if (src <= puVar1) {
                puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
                uVar33 = *(ulong *)((long)src + 8);
                *puVar27 = *src;
                puVar27[1] = uVar33;
                puVar30 = puVar1;
                if (0x10 < (long)puVar1 - (long)src) {
                  lVar34 = 0x10;
                  do {
                    uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                    puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                    *puVar3 = *(undefined8 *)((long)src + lVar34);
                    puVar3[1] = uVar16;
                    pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                    uVar16 = *(undefined8 *)(pBVar21 + 8);
                    puVar3[2] = *(undefined8 *)pBVar21;
                    puVar3[3] = uVar16;
                    lVar34 = lVar34 + 0x20;
                  } while (puVar3 + 4 < puVar39);
                }
              }
              if (puVar30 < puVar40) {
                lVar34 = 0;
                do {
                  *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
                  lVar34 = lVar34 + 1;
                } while ((long)puVar40 - (long)puVar30 != lVar34);
              }
            }
            else {
              puVar39 = (ulong *)seqStore->lit;
              uVar33 = *(ulong *)((long)src + 8);
              *puVar39 = *src;
              puVar39[1] = uVar33;
              if (0x10 < uVar29) {
                pBVar21 = seqStore->lit;
                uVar33 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar21 + 0x18) = uVar33;
                if (0x20 < (long)uVar29) {
                  lVar34 = 0;
                  do {
                    pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                    uVar16 = *(undefined8 *)(pBVar5 + 8);
                    pBVar2 = pBVar21 + lVar34 + 0x20;
                    *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 8) = uVar16;
                    pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                    uVar16 = *(undefined8 *)(pBVar5 + 8);
                    *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                    *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                    lVar34 = lVar34 + 0x20;
                  } while (pBVar2 + 0x20 < pBVar21 + uVar29);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar29;
            if (0xffff < uVar29) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            UVar38 = UVar41 - (uVar36 + uVar25);
            psVar14 = seqStore->sequences;
            psVar14->litLength = (U16)uVar29;
            psVar14->offset = UVar38 + 3;
            if ((BYTE *)0xffff < unaff_R13 + -3) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar14->matchLength = (U16)(unaff_R13 + -3);
            seqStore->sequences = psVar14 + 1;
            bVar17 = true;
            UVar42 = local_10c;
            local_10c = UVar38;
          }
          else {
            puVar40 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + uVar23);
            bVar17 = false;
          }
          puVar39 = puVar40;
          if (bVar17) goto LAB_005e87c9;
        }
      }
      else {
        puVar40 = (ulong *)((long)puVar39 + 1);
        puVar27 = iEnd;
        if (uVar18 < uVar6) {
          puVar27 = mEnd;
        }
        sVar20 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar39 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                            (BYTE *)puVar27,iStart);
        uVar29 = (long)puVar40 - (long)src;
        if (puVar1 < puVar40) {
          puVar27 = (ulong *)seqStore->lit;
          puVar39 = puVar27;
          puVar30 = (ulong *)src;
          if (src <= puVar1) {
            puVar39 = (ulong *)((long)puVar27 + ((long)puVar1 - (long)src));
            uVar33 = *(ulong *)((long)src + 8);
            *puVar27 = *src;
            puVar27[1] = uVar33;
            puVar30 = puVar1;
            if (0x10 < (long)puVar1 - (long)src) {
              lVar34 = 0x10;
              do {
                uVar16 = *(undefined8 *)((BYTE *)((long)src + lVar34) + 8);
                puVar3 = (undefined8 *)((long)puVar27 + lVar34);
                *puVar3 = *(undefined8 *)((long)src + lVar34);
                puVar3[1] = uVar16;
                pBVar21 = (BYTE *)((long)src + lVar34 + 0x10);
                uVar16 = *(undefined8 *)(pBVar21 + 8);
                puVar3[2] = *(undefined8 *)pBVar21;
                puVar3[3] = uVar16;
                lVar34 = lVar34 + 0x20;
              } while (puVar3 + 4 < puVar39);
            }
          }
          if (puVar30 < puVar40) {
            lVar34 = 0;
            do {
              *(BYTE *)((long)puVar39 + lVar34) = *(BYTE *)((long)puVar30 + lVar34);
              lVar34 = lVar34 + 1;
            } while ((long)puVar40 - (long)puVar30 != lVar34);
          }
        }
        else {
          puVar39 = (ulong *)seqStore->lit;
          uVar33 = *(ulong *)((long)src + 8);
          *puVar39 = *src;
          puVar39[1] = uVar33;
          if (0x10 < uVar29) {
            pBVar21 = seqStore->lit;
            uVar33 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar21 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar21 + 0x18) = uVar33;
            if (0x20 < (long)uVar29) {
              lVar34 = 0;
              do {
                pBVar5 = (BYTE *)((long)src + lVar34 + 0x20);
                uVar16 = *(undefined8 *)(pBVar5 + 8);
                pBVar2 = pBVar21 + lVar34 + 0x20;
                *(undefined8 *)pBVar2 = *(undefined8 *)pBVar5;
                *(undefined8 *)(pBVar2 + 8) = uVar16;
                pBVar5 = (BYTE *)((long)src + lVar34 + 0x30);
                uVar16 = *(undefined8 *)(pBVar5 + 8);
                *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)pBVar5;
                *(undefined8 *)(pBVar2 + 0x18) = uVar16;
                lVar34 = lVar34 + 0x20;
              } while (pBVar2 + 0x20 < pBVar21 + uVar29);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar29;
        if (0xffff < uVar29) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        unaff_R13 = (BYTE *)(sVar20 + 4);
        pBVar21 = (BYTE *)(sVar20 + 1);
        psVar14 = *ppsVar19;
        psVar14->litLength = (U16)uVar29;
        psVar14->offset = 1;
        UVar38 = local_10c;
joined_r0x005e8539:
        local_10c = UVar38;
        if ((BYTE *)0xffff < pBVar21) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar14->matchLength = (U16)pBVar21;
        *ppsVar19 = psVar14 + 1;
LAB_005e87c9:
        src = (void *)((long)puVar40 + (long)unaff_R13);
        puVar39 = (ulong *)src;
        if (src <= puVar4) {
          pUVar12[(uint)(*(int *)(pBVar9 + (uVar24 & 0xffffffff) + 2) * -0x61c8864f) >>
                  (bVar22 & 0x1f)] = UVar41 + 2;
          pUVar12[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar22 & 0x1f)] =
               ((int)src + -2) - iVar43;
          do {
            puVar39 = (ulong *)src;
            if (puVar4 < src) break;
            UVar41 = (int)src - iVar43;
            uVar25 = UVar41 - UVar42;
            pBVar21 = pBVar9;
            if (uVar25 < uVar6) {
              pBVar21 = pBVar11 + -uVar37;
            }
            if (((uVar6 - 1) - uVar25 < 3) || (*(int *)(pBVar21 + uVar25) != (int)*src)) {
              bVar17 = false;
              UVar41 = UVar42;
            }
            else {
              puVar39 = iEnd;
              if (uVar25 < uVar6) {
                puVar39 = mEnd;
              }
              sVar20 = ZSTD_count_2segments
                                 ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar25) + 4),
                                  (BYTE *)iEnd,(BYTE *)puVar39,iStart);
              if (src <= puVar1) {
                puVar39 = (ulong *)seqStore->lit;
                uVar24 = *(ulong *)((long)src + 8);
                *puVar39 = *src;
                puVar39[1] = uVar24;
              }
              psVar14 = seqStore->sequences;
              psVar14->litLength = 0;
              psVar14->offset = 1;
              if (0xffff < sVar20 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar14->matchLength = (U16)(sVar20 + 1);
              seqStore->sequences = psVar14 + 1;
              pUVar12[(uint)((int)*src * -0x61c8864f) >> (bVar22 & 0x1f)] = UVar41;
              src = (void *)((long)src + sVar20 + 4);
              bVar17 = true;
              UVar41 = local_10c;
              local_10c = UVar42;
            }
            UVar42 = UVar41;
            puVar39 = (ulong *)src;
          } while (bVar17);
        }
      }
    } while (puVar39 < puVar4);
  }
  *rep = local_10c;
  rep[1] = UVar42;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}